

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

void __thiscall
t_netstd_generator::generate_netstd_struct_definition
          (t_netstd_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool in_class,
          bool is_result)

{
  int *piVar1;
  pointer pcVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  undefined4 extraout_var;
  iterator iVar7;
  ostream *poVar8;
  pointer pptVar9;
  t_type *type;
  long *plVar10;
  ostream *poVar11;
  undefined7 in_register_00000009;
  size_type *psVar12;
  t_field *ptVar13;
  pointer pptVar14;
  char *pcVar15;
  t_netstd_generator *ptVar16;
  undefined7 in_register_00000081;
  long lVar17;
  t_struct *ptVar18;
  bool bVar19;
  bool bVar20;
  string local_1f0;
  t_struct *local_1d0;
  ostream *local_1c8;
  string local_1c0;
  undefined4 local_19c;
  string local_198;
  string sharp_struct_name;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_19c = (undefined4)CONCAT71(in_register_00000009,is_exception);
  if ((int)CONCAT71(in_register_00000081,in_class) == 0) {
    start_netstd_namespace(this,out);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  generate_netstd_doc(this,out,(t_doc *)tstruct);
  for (pptVar14 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      pptVar14 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar14 = pptVar14 + 1) {
    collect_extensions_types(this,(*pptVar14)->type_);
  }
  iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  prepare_member_name_mapping
            (this,tstruct,&tstruct->members_,(string *)CONCAT44(extraout_var,iVar6));
  if (this->serialize_ == false) {
    if (this->wcf_ != true || (byte)local_19c != '\0') goto LAB_002ba60b;
  }
  else if ((byte)local_19c != '\0') goto LAB_002ba60b;
  t_generator::indent_abi_cxx11_(&sharp_struct_name,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,sharp_struct_name._M_dataplus._M_p,sharp_struct_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[DataContract(Namespace=\"",0x19);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(this->wcf_namespace_)._M_dataplus._M_p,
                      (this->wcf_namespace_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")]",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sharp_struct_name._M_dataplus._M_p != &sharp_struct_name.field_2) {
    operator_delete(sharp_struct_name._M_dataplus._M_p);
  }
LAB_002ba60b:
  sharp_struct_name._M_dataplus._M_p = (pointer)&sharp_struct_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sharp_struct_name,"final","");
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(tstruct->super_t_type).annotations_._M_t,&sharp_struct_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sharp_struct_name._M_dataplus._M_p != &sharp_struct_name.field_2) {
    operator_delete(sharp_struct_name._M_dataplus._M_p);
  }
  local_1d0 = tstruct;
  type_name_abi_cxx11_(&sharp_struct_name,this,&tstruct->super_t_type,false);
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public ",7);
  pcVar15 = "sealed ";
  lVar17 = 7;
  if ((_Rb_tree_header *)iVar7._M_node ==
      &(local_1d0->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header) {
    pcVar15 = "";
    lVar17 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar15,lVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"partial class ",0xe);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,sharp_struct_name._M_dataplus._M_p,sharp_struct_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," : ",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  ptVar18 = local_1d0;
  if ((byte)local_19c != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(out,"TException, ",0xc);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"TBase",5);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar14 = (ptVar18->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  pptVar9 = (ptVar18->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_1c8 = out;
  if (pptVar14 != pptVar9) {
    do {
      if ((*pptVar14)->req_ != T_REQUIRED) {
        t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"private ",8);
        ptVar13 = *pptVar14;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_","");
        declare_field(&local_1c0,this,ptVar13,false,&local_50);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        out = local_1c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        pptVar9 = (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      pptVar14 = pptVar14 + 1;
    } while (pptVar14 != pptVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar18 = local_1d0;
  pptVar14 = (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (pptVar14 ==
      (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar19 = false;
  }
  else {
    bVar19 = false;
    bVar4 = 0;
    do {
      bVar5 = bVar4;
      generate_netstd_doc(this,out,*pptVar14);
      generate_property(this,out,*pptVar14,true,true);
      bVar20 = (*pptVar14)->req_ == T_REQUIRED;
      bVar3 = !bVar20;
      bVar19 = (bool)(bVar19 | bVar20);
      pptVar14 = pptVar14 + 1;
      bVar4 = bVar5 | bVar3;
    } while (pptVar14 !=
             (ptVar18->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if ((bool)(bVar5 | bVar3)) {
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((this->serialize_ != false) || (this->wcf_ == true)) {
        t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[DataMember(Order = 1)]",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
      }
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public Isset __isset;",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if ((this->serialize_ != false) || (this->wcf_ == true)) {
        t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[DataContract]",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
      }
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public struct Isset",0x13);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      iVar6 = (this->super_t_oop_generator).super_t_generator.indent_;
      (this->super_t_oop_generator).super_t_generator.indent_ = iVar6 + 1;
      pptVar14 = (ptVar18->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar9 = (ptVar18->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pptVar14 != pptVar9) {
        do {
          if ((*pptVar14)->req_ != T_REQUIRED) {
            if ((this->serialize_ != false) || (this->wcf_ == true)) {
              t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1c8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[DataMember]",0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p);
              }
            }
            t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1c8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public bool ",0xc);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            pcVar2 = ((*pptVar14)->name_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar2,pcVar2 + ((*pptVar14)->name_)._M_string_length);
            ptVar16 = this;
            normalize_name(&local_198,this,&local_f0,false);
            get_isset_name(&local_1c0,ptVar16,&local_198);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            pptVar9 = (local_1d0->members_).
                      super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          pptVar14 = pptVar14 + 1;
        } while (pptVar14 != pptVar9);
        iVar6 = (this->super_t_oop_generator).super_t_generator.indent_ + -1;
      }
      (this->super_t_oop_generator).super_t_generator.indent_ = iVar6;
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      out = local_1c8;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1c8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      ptVar18 = local_1d0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if ((this->serialize_ != false) || (this->wcf_ == true)) {
        t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"#region XmlSerializer support",0x1d);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        pptVar14 = (ptVar18->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar9 = (ptVar18->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (pptVar14 != pptVar9) {
          do {
            if ((*pptVar14)->req_ != T_REQUIRED) {
              t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1c8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"public bool ShouldSerialize",0x1b);
              prop_name_abi_cxx11_(&local_1c0,this,*pptVar14,false);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"()",2);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                                  ::endl_abi_cxx11_._M_string_length);
              t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_198._M_dataplus._M_p,local_198._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p);
              }
              piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
              *piVar1 = *piVar1 + 1;
              t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1c8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return __isset.",0xf);
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              pcVar2 = ((*pptVar14)->name_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_110,pcVar2,pcVar2 + ((*pptVar14)->name_)._M_string_length)
              ;
              ptVar16 = this;
              normalize_name(&local_198,this,&local_110,false);
              get_isset_name(&local_1c0,ptVar16,&local_198);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p);
              }
              piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
              *piVar1 = *piVar1 + -1;
              t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1c8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                                  ::endl_abi_cxx11_._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p);
              }
              pptVar9 = (local_1d0->members_).
                        super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            pptVar14 = pptVar14 + 1;
          } while (pptVar14 != pptVar9);
        }
        t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
        out = local_1c8;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1c8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        ptVar18 = local_1d0;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"#endregion XmlSerializer support",0x20);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
      }
    }
  }
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public ",7);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,sharp_struct_name._M_dataplus._M_p,sharp_struct_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"()",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  iVar6 = (this->super_t_oop_generator).super_t_generator.indent_;
  (this->super_t_oop_generator).super_t_generator.indent_ = iVar6 + 1;
  pptVar14 = (ptVar18->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar14 !=
      (ptVar18->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      type = resolve_typedef((*pptVar14)->type_);
      ptVar13 = *pptVar14;
      if (ptVar13->value_ != (t_const_value *)0x0) {
        if (ptVar13->req_ == T_REQUIRED) {
          prop_name_abi_cxx11_(&local_1f0,this,ptVar13,false);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,0x38cdaf);
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          psVar12 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_150.field_2._M_allocated_capacity = *psVar12;
            local_150.field_2._8_8_ = plVar10[3];
          }
          else {
            local_150.field_2._M_allocated_capacity = *psVar12;
            local_150._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_150._M_string_length = plVar10[1];
          *plVar10 = (long)psVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          print_const_value(this,local_1c8,&local_150,type,(*pptVar14)->value_,true,true,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) goto LAB_002bb5f4;
        }
        else {
          std::operator+(&local_d0,"this._",&ptVar13->name_);
          print_const_value(this,local_1c8,&local_d0,type,(*pptVar14)->value_,true,true,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1c8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"this.__isset.",0xd);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          pcVar2 = ((*pptVar14)->name_)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar2,pcVar2 + ((*pptVar14)->name_)._M_string_length);
          ptVar16 = this;
          normalize_name(&local_198,this,&local_130,false);
          get_isset_name(&local_1c0,ptVar16,&local_198);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," = true;",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
LAB_002bb5f4:
            operator_delete(local_1f0._M_dataplus._M_p);
          }
        }
      }
      pptVar14 = pptVar14 + 1;
    } while (pptVar14 !=
             (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
    iVar6 = (this->super_t_oop_generator).super_t_generator.indent_ + -1;
  }
  (this->super_t_oop_generator).super_t_generator.indent_ = iVar6;
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar8 = local_1c8;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_1c8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"}",1);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if (bVar19) {
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public ",7);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,sharp_struct_name._M_dataplus._M_p,sharp_struct_name._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
    ptVar18 = local_1d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    pptVar14 = (ptVar18->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    pptVar9 = (ptVar18->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pptVar14 != pptVar9) {
      bVar19 = true;
      do {
        ptVar13 = *pptVar14;
        if (ptVar13->req_ == T_REQUIRED) {
          if (!bVar19) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1c8,", ",2);
            ptVar13 = *pptVar14;
          }
          type_name_abi_cxx11_(&local_1f0,this,ptVar13->type_,true);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1c8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          pcVar2 = ((*pptVar14)->name_)._M_dataplus._M_p;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar2,pcVar2 + ((*pptVar14)->name_)._M_string_length);
          normalize_name(&local_1c0,this,&local_70,false);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
          pptVar9 = (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          bVar19 = false;
        }
        pptVar14 = pptVar14 + 1;
      } while (pptVar14 != pptVar9);
    }
    poVar8 = local_1c8;
    std::__ostream_insert<char,std::char_traits<char>>(local_1c8,") : this()",10);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    ptVar18 = local_1d0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    iVar6 = (this->super_t_oop_generator).super_t_generator.indent_;
    (this->super_t_oop_generator).super_t_generator.indent_ = iVar6 + 1;
    pptVar14 = (ptVar18->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    pptVar9 = (ptVar18->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pptVar14 != pptVar9) {
      do {
        if ((*pptVar14)->req_ == T_REQUIRED) {
          t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1c8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"this.",5);
          prop_name_abi_cxx11_(&local_1c0,this,*pptVar14,false);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
          pcVar2 = ((*pptVar14)->name_)._M_dataplus._M_p;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar2,pcVar2 + ((*pptVar14)->name_)._M_string_length);
          normalize_name(&local_198,this,&local_90,false);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_198._M_dataplus._M_p,local_198._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
          pptVar9 = (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        pptVar14 = pptVar14 + 1;
      } while (pptVar14 != pptVar9);
      iVar6 = (this->super_t_oop_generator).super_t_generator.indent_ + -1;
    }
    (this->super_t_oop_generator).super_t_generator.indent_ = iVar6;
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar8 = local_1c8;
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1c8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"}",1);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,sharp_struct_name._M_dataplus._M_p,
             sharp_struct_name._M_dataplus._M_p + sharp_struct_name._M_string_length);
  generate_netstd_deepcopy_method(this,poVar8,local_1d0,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  generate_netstd_struct_reader(this,poVar8,local_1d0);
  ptVar18 = local_1d0;
  if (is_result) {
    generate_netstd_struct_result_writer(this,poVar8,local_1d0);
  }
  else {
    generate_netstd_struct_writer(this,poVar8,local_1d0);
  }
  generate_netstd_struct_equals(this,poVar8,ptVar18);
  generate_netstd_struct_hashcode(this,poVar8,ptVar18);
  generate_netstd_struct_tostring(this,poVar8,ptVar18);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"}",1);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  ptVar18 = local_1d0;
  bVar4 = (byte)local_19c;
  if (this->serialize_ == false) {
    bVar4 = this->wcf_ & (byte)local_19c;
  }
  if (bVar4 != 0) {
    generate_netstd_wcffault(this,poVar8,local_1d0);
  }
  cleanup_member_name_mapping(this,ptVar18);
  if ((!in_class) && ((this->namespace_name_)._M_string_length != 0)) {
    t_oop_generator::scope_down(&this->super_t_oop_generator,poVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sharp_struct_name._M_dataplus._M_p != &sharp_struct_name.field_2) {
    operator_delete(sharp_struct_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_definition(ostream& out, t_struct* tstruct, bool is_exception, bool in_class, bool is_result)
{
    if (!in_class)
    {
        start_netstd_namespace(out);
    }

    out << endl;

    generate_netstd_doc(out, tstruct);
    collect_extensions_types(tstruct);
    prepare_member_name_mapping(tstruct);

    if ((is_serialize_enabled() || is_wcf_enabled()) && !is_exception)
    {
        out << indent() << "[DataContract(Namespace=\"" << wcf_namespace_ << "\")]" << endl;
    }

    bool is_final = tstruct->annotations_.find("final") != tstruct->annotations_.end();

    string sharp_struct_name = type_name(tstruct, false);

    out << indent() << "public " << (is_final ? "sealed " : "") << "partial class " << sharp_struct_name << " : ";

    if (is_exception)
    {
        out << "TException, ";
    }

    out << "TBase" << endl
        << indent() << "{" << endl;
    indent_up();

    const vector<t_field*>& members = tstruct->get_members();
    vector<t_field*>::const_iterator m_iter;

    // make private members with public Properties
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
    {
        // if the field is required, then we use auto-properties
        if (!field_is_required((*m_iter)))
        {
            out << indent() << "private " << declare_field(*m_iter, false, "_") << endl;
        }
    }
    out << endl;

    bool has_non_required_fields = false;
    bool has_required_fields = false;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
    {
        generate_netstd_doc(out, *m_iter);
        generate_property(out, *m_iter, true, true);
        bool is_required = field_is_required((*m_iter));
        if (is_required)
        {
            has_required_fields = true;
    }
        else
        {
            has_non_required_fields = true;
        }
    }

    bool generate_isset = has_non_required_fields;
    if (generate_isset)
    {
        out << endl;
        if (is_serialize_enabled() || is_wcf_enabled())
        {
            out << indent() << "[DataMember(Order = 1)]" << endl;
        }
        out << indent() << "public Isset __isset;" << endl;
        if (is_serialize_enabled() || is_wcf_enabled())
        {
            out << indent() << "[DataContract]" << endl;
        }

        out << indent() << "public struct Isset" << endl
            << indent() << "{" << endl;
        indent_up();

        for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
        {
            bool is_required = field_is_required((*m_iter));
            // if it is required, don't need Isset for that variable
            // if it is not required, if it has a default value, we need to generate Isset
            if (!is_required)
            {
                if (is_serialize_enabled() || is_wcf_enabled())
                {
                    out << indent() << "[DataMember]" << endl;
                }
                out << indent() << "public bool " << get_isset_name(normalize_name((*m_iter)->get_name())) << ";" << endl;
            }
        }

        indent_down();
        out << indent() << "}" << endl << endl;

        if (generate_isset && (is_serialize_enabled() || is_wcf_enabled()))
        {
            out << indent() << "#region XmlSerializer support" << endl << endl;

            for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
            {
                bool is_required = field_is_required(*m_iter);
                // if it is required, don't need Isset for that variable
                // if it is not required, if it has a default value, we need to generate Isset
                if (!is_required)
                {
                    out << indent() << "public bool ShouldSerialize" << prop_name(*m_iter) << "()" << endl
                        << indent() << "{" << endl;
                    indent_up();
                    out << indent() << "return __isset." << get_isset_name(normalize_name((*m_iter)->get_name())) << ";" << endl;
                    indent_down();
                    out << indent() << "}" << endl << endl;
                }
            }

            out << indent() << "#endregion XmlSerializer support" << endl << endl;
        }
    }

    // We always want a default, no argument constructor for Reading
    out << indent() << "public " << sharp_struct_name << "()" << endl
        << indent() << "{" << endl;
    indent_up();

    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
    {
        t_type* t = (*m_iter)->get_type();
        t = resolve_typedef(t);

        if ((*m_iter)->get_value() != nullptr)
        {
            if (field_is_required((*m_iter)))
            {
                print_const_value(out, "this." + prop_name(*m_iter), t, (*m_iter)->get_value(), true, true);
            }
            else
            {
                print_const_value(out, "this._" + (*m_iter)->get_name(), t, (*m_iter)->get_value(), true, true);
                // Optionals with defaults are marked set
                out << indent() << "this.__isset." << get_isset_name(normalize_name((*m_iter)->get_name())) << " = true;" << endl;
            }
        }
    }
    indent_down();
    out << indent() << "}" << endl << endl;

    // if we have required fields, we add that CTOR too
    if (has_required_fields)
    {
        out << indent() << "public " << sharp_struct_name << "(";
        bool first = true;
        for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
        {
            if (field_is_required(*m_iter))
            {
                if (first)
                {
                    first = false;
                }
                else
                {
                    out << ", ";
                }
                out << type_name((*m_iter)->get_type()) << " " << normalize_name((*m_iter)->get_name());
            }
        }
        out << ") : this()" << endl
            << indent() << "{" << endl;
        indent_up();

        for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
        {
            if (field_is_required(*m_iter))
            {
                out << indent() << "this." << prop_name(*m_iter) << " = " << normalize_name((*m_iter)->get_name()) << ";" << endl;
            }
        }

        indent_down();
        out << indent() << "}" << endl << endl;
    }

    // DeepCopy()
    generate_netstd_deepcopy_method(out, tstruct, sharp_struct_name);

    generate_netstd_struct_reader(out, tstruct);
    if (is_result)
    {
        generate_netstd_struct_result_writer(out, tstruct);
    }
    else
    {
        generate_netstd_struct_writer(out, tstruct);
    }
    generate_netstd_struct_equals(out, tstruct);
    generate_netstd_struct_hashcode(out, tstruct);
    generate_netstd_struct_tostring(out, tstruct);

    indent_down();
    out << indent() << "}" << endl << endl;

    // generate a corresponding WCF fault to wrap the exception
    if ((is_serialize_enabled() || is_wcf_enabled()) && is_exception)
    {
        generate_netstd_wcffault(out, tstruct);
    }

    cleanup_member_name_mapping(tstruct);
    if (!in_class)
    {
        end_netstd_namespace(out);
    }
}